

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.h
# Opt level: O2

void __thiscall
slang::ast::RandCaseStatement::visitExprs<register_has_no_reset::AlwaysFFVisitor&>
          (RandCaseStatement *this,AlwaysFFVisitor *visitor)

{
  pointer pIVar1;
  size_t sVar2;
  long lVar3;
  
  pIVar1 = (this->items)._M_ptr;
  sVar2 = (this->items)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 4 != lVar3; lVar3 = lVar3 + 0x10) {
    Expression::visit<register_has_no_reset::AlwaysFFVisitor&>
              (*(Expression **)((long)&(pIVar1->expr).ptr + lVar3),visitor);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& item : items)
            item.expr->visit(visitor);
    }